

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<unsigned_int>::test_pow2_numerators<(libdivide::Branching)1>
          (DivideTest<unsigned_int> *this,uint denom,
          divider<unsigned_int,_(libdivide::Branching)1> *the_divider)

{
  divider<unsigned_int,_(libdivide::Branching)1> *in_stack_00000010;
  uint numerator;
  int j;
  int i;
  undefined4 local_20;
  undefined4 local_1c;
  
  for (local_1c = 1; local_1c < 0x20; local_1c = local_1c + 1) {
    for (local_20 = -1; local_20 < 2; local_20 = local_20 + 1) {
      test_one<(libdivide::Branching)1>
                ((DivideTest<unsigned_int> *)the_divider,i,j,in_stack_00000010);
    }
  }
  return;
}

Assistant:

void test_pow2_numerators(T denom, const divider<T, ALGO> &the_divider) {
        // test power of 2 numerators: 2^i-1, 2^i, 2^i+1
        for (int i = 1; i < limits::digits; i++) {
            for (int j = -1; j <= 1; j++) {
                T numerator = static_cast<T>((static_cast<T>(1) << i) + j);
                test_one(numerator, denom, the_divider);

                if (limits::is_signed) {
                    test_one(-numerator, denom, the_divider);
                }
            }
        }
    }